

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-x86_64.c
# Opt level: O0

void va_block_arg_builtin(void *res,void *p,size_t s,uint64_t ncase)

{
  ulong uVar1;
  undefined8 local_58;
  anon_union_8_2_94730066 u [2];
  void *a;
  size_t size;
  x86_64_va_list *va;
  uint64_t ncase_local;
  size_t s_local;
  void *p_local;
  void *res_local;
  
  uVar1 = s + 7 & 0xfffffffffffffff8;
  if (ncase == 1) {
    if (*p + uVar1 < 0x31) {
      local_58 = *(undefined8 *)(*(long *)((long)p + 0x10) + (ulong)*p);
      *(int *)p = *p + 8;
      if (8 < uVar1) {
        u[0] = *(anon_union_8_2_94730066 *)(*(long *)((long)p + 0x10) + (ulong)*p);
        *(int *)p = *p + 8;
      }
      if (res == (void *)0x0) {
        return;
      }
      memcpy(res,&local_58,s);
      return;
    }
  }
  else {
    if (ncase == 2) {
      local_58 = *(undefined8 *)(*(long *)((long)p + 0x10) + (ulong)*(uint *)((long)p + 4));
      *(int *)((long)p + 4) = *(int *)((long)p + 4) + 0x10;
      if (8 < uVar1) {
        u[0] = *(anon_union_8_2_94730066 *)
                (*(long *)((long)p + 0x10) + (ulong)*(uint *)((long)p + 4));
        *(int *)((long)p + 4) = *(int *)((long)p + 4) + 0x10;
      }
      if (res == (void *)0x0) {
        return;
      }
      memcpy(res,&local_58,s);
      return;
    }
    if (((ncase - 3 < 2) && (*(uint *)((long)p + 4) < 0xa1)) && (*p < 0x29)) {
      if (ncase == 3) {
        local_58 = *(undefined8 *)(*(long *)((long)p + 0x10) + (ulong)*p);
        u[0] = *(anon_union_8_2_94730066 *)
                (*(long *)((long)p + 0x10) + (ulong)*(uint *)((long)p + 4));
      }
      else {
        local_58 = *(undefined8 *)(*(long *)((long)p + 0x10) + (ulong)*(uint *)((long)p + 4));
        u[0] = *(anon_union_8_2_94730066 *)(*(long *)((long)p + 0x10) + (ulong)*p);
      }
      *(int *)((long)p + 4) = *(int *)((long)p + 4) + 8;
      *(int *)p = *p + 8;
      if (res == (void *)0x0) {
        return;
      }
      memcpy(res,&local_58,s);
      return;
    }
  }
  if (res != (void *)0x0) {
    memcpy(res,*(void **)((long)p + 8),s);
  }
  *(ulong *)((long)p + 8) = uVar1 + *(long *)((long)p + 8);
  return;
}

Assistant:

void va_block_arg_builtin (void *res, void *p, size_t s, uint64_t ncase) {
  struct x86_64_va_list *va = p;
  size_t size = ((s + 7) / 8) * 8;
  void *a = va->overflow_arg_area;
  union {
    uint64_t i;
    double d;
  } u[2];

  switch (ncase) {
  case 1:
    if (va->gp_offset + size > 48) break;
    u[0].i = *(uint64_t *) ((char *) va->reg_save_area + va->gp_offset);
    va->gp_offset += 8;
    if (size > 8) {
      u[1].i = *(uint64_t *) ((char *) va->reg_save_area + va->gp_offset);
      va->gp_offset += 8;
    }
    if (res != NULL) memcpy (res, &u, s);
    return;
  case 2:
    u[0].d = *(double *) ((char *) va->reg_save_area + va->fp_offset);
    va->fp_offset += 16;
    if (size > 8) {
      u[1].d = *(double *) ((char *) va->reg_save_area + va->fp_offset);
      va->fp_offset += 16;
    }
    if (res != NULL) memcpy (res, &u, s);
    return;
  case 3:
  case 4:
    if (va->fp_offset > 160 || va->gp_offset > 40) break;
    if (ncase == 3) {
      u[0].i = *(uint64_t *) ((char *) va->reg_save_area + va->gp_offset);
      u[1].d = *(double *) ((char *) va->reg_save_area + va->fp_offset);
    } else {
      u[0].d = *(double *) ((char *) va->reg_save_area + va->fp_offset);
      u[1].i = *(uint64_t *) ((char *) va->reg_save_area + va->gp_offset);
    }
    va->fp_offset += 8;
    va->gp_offset += 8;
    if (res != NULL) memcpy (res, &u, s);
    return;
  default: break;
  }
  if (res != NULL) memcpy (res, a, s);
  va->overflow_arg_area += size / 8;
}